

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O1

BackgroundData *
qvariant_cast<QCss::BackgroundData>(BackgroundData *__return_storage_ptr__,QVariant *v)

{
  PrivateShared *pPVar1;
  undefined8 uVar2;
  Data *pDVar3;
  bool bVar4;
  QMetaType QVar5;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QCss::BackgroundData>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(v->d).field_0x18 & 0xfffffffffffffffc);
  bVar4 = comparesEqual(&local_28,&local_20);
  if (bVar4) {
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    QBrush::QBrush((QBrush *)__return_storage_ptr__,(QBrush *)v);
    uVar2 = *(undefined8 *)&((PrivateShared *)((long)v + 8))->field_0x0;
    (__return_storage_ptr__->brush).role = (int)uVar2;
    (__return_storage_ptr__->brush).type = (int)((ulong)uVar2 >> 0x20);
    pDVar3 = *(Data **)&((PrivateShared *)((long)v + 0x10))->field_0x0;
    (__return_storage_ptr__->image).d.d = pDVar3;
    (__return_storage_ptr__->image).d.ptr =
         *(char16_t **)&((PrivateShared *)((long)v + 0x18))->field_0x0;
    (__return_storage_ptr__->image).d.size =
         (qsizetype)(((Private *)&((PrivateShared *)((long)v + 0x20))->field_0x0)->data).shared;
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    uVar2 = *(undefined8 *)&((PrivateShared *)((long)v + 0x28))->field_0x0;
    __return_storage_ptr__->repeat = (int)uVar2;
    __return_storage_ptr__->alignment = (Alignment)(int)((ulong)uVar2 >> 0x20);
  }
  else {
    (__return_storage_ptr__->image).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&__return_storage_ptr__->repeat = &DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->image).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->image).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->brush).brush.d._M_t.
    super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter> =
         (_Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(__return_storage_ptr__->brush).role = &DAT_aaaaaaaaaaaaaaaa;
    QBrush::QBrush((QBrush *)__return_storage_ptr__);
    (__return_storage_ptr__->brush).role = NoRole;
    *(undefined8 *)&(__return_storage_ptr__->brush).type = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->image).d.d + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->image).d.ptr + 4) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->image).d.size + 4) = 0;
    (__return_storage_ptr__->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
    super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
    QVar5.d_ptr = (QMetaTypeInterface *)QVariant::metaType();
    if (((v->d).field_0x18 & 1) != 0) {
      pPVar1 = (v->d).data.shared;
      v = (QVariant *)(pPVar1 + *(int *)(pPVar1 + 4));
    }
    QMetaType::convert(QVar5,v,local_20,__return_storage_ptr__);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(const QVariant &v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType)
        return v.d.get<T>();
    if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}